

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalGetThreadPriority(CPalThread *pThread,HANDLE hThread,int *piPriority)

{
  PAL_ERROR PVar1;
  CPalThread *local_40;
  CPalThread *pTargetThread;
  IPalObject *pobjThread;
  
  pTargetThread = (CPalThread *)0x0;
  PVar1 = InternalGetThreadDataFromHandle(pThread,hThread,0,&local_40,(IPalObject **)&pTargetThread)
  ;
  if (PVar1 == 0) {
    InternalEnterCriticalSection(pThread,&local_40->m_csLock);
    *piPriority = local_40->m_iThreadPriority;
    InternalLeaveCriticalSection(pThread,&local_40->m_csLock);
  }
  if (pTargetThread != (CPalThread *)0x0) {
    (*pTargetThread->_vptr_CPalThread[8])(pTargetThread,pThread);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetThreadPriority(
    CPalThread *pThread,
    HANDLE hThread,
    int *piPriority
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pTargetThread;
    IPalObject *pobjThread = NULL;

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0,  // THREAD_QUERY_INFORMATION
        &pTargetThread,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetThreadPriorityExit;
    }

    pTargetThread->Lock(pThread);

    *piPriority = pTargetThread->GetThreadPriority();

    pTargetThread->Unlock(pThread);

InternalGetThreadPriorityExit:

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    return palError;
}